

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

PAL_ERROR PROCGetProcessStatus
                    (CPalThread *pThread,HANDLE hProcess,PROCESS_STATE *pps,DWORD *pdwExitCode)

{
  int iVar1;
  int *piVar2;
  uint local_50;
  uint local_4c;
  int status;
  pid_t wait_retval;
  CProcProcessLocalData *pLocalData;
  IDataLock *pDataLock;
  IPalObject *pobjProcess;
  DWORD *pDStack_28;
  PAL_ERROR palError;
  DWORD *pdwExitCode_local;
  PROCESS_STATE *pps_local;
  HANDLE hProcess_local;
  CPalThread *pThread_local;
  
  pobjProcess._4_4_ = 0;
  pDataLock = (IDataLock *)0x0;
  pDStack_28 = pdwExitCode;
  pdwExitCode_local = pps;
  pps_local = (PROCESS_STATE *)hProcess;
  hProcess_local = pThread;
  pobjProcess._4_4_ =
       (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                 (CorUnix::g_pObjectManager,pThread,hProcess,&aotProcess,0,&pDataLock);
  if (pobjProcess._4_4_ == 0) {
    pobjProcess._4_4_ =
         (*pDataLock->_vptr_IDataLock[3])(pDataLock,hProcess_local,1,&pLocalData,&status);
    if (_status[1] == 3) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      *pdwExitCode_local = _status[1];
      *pDStack_28 = _status[2];
      (*(code *)**(undefined8 **)pLocalData)(pLocalData,hProcess_local,0);
    }
    else {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      while (local_4c = waitpid(*_status,(int *)&local_50,1), local_4c != *_status) {
        if (local_4c == 0) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          *pdwExitCode_local = 2;
          *pDStack_28 = 0;
          goto LAB_0016cd14;
        }
        if (local_4c != 0xffffffff) {
          fprintf(_stderr,"] %s %s:%d","PROCGetProcessStatus",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                  ,0x8ef);
          fprintf(_stderr,"waitpid returned unexpected value %d\n",(ulong)local_4c);
          *pDStack_28 = 1;
          *pdwExitCode_local = 3;
          goto LAB_0016cd14;
        }
        piVar2 = __errno_location();
        if (*piVar2 != 4) {
          piVar2 = __errno_location();
          if (*piVar2 == 10) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            iVar1 = kill(*_status,0);
            if (iVar1 == 0) {
              *pdwExitCode_local = 2;
              *pDStack_28 = 0;
            }
            else {
              piVar2 = __errno_location();
              if (*piVar2 == 3) {
                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                  abort();
                }
                *pDStack_28 = 0;
              }
              else {
                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                  abort();
                }
                piVar2 = __errno_location();
                strerror(*piVar2);
                *pDStack_28 = 1;
              }
              *pdwExitCode_local = 3;
            }
          }
          else {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
            piVar2 = __errno_location();
            strerror(*piVar2);
            *pdwExitCode_local = 2;
            *pDStack_28 = 0;
          }
          goto LAB_0016cd14;
        }
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
      }
      if ((local_50 & 0x7f) == 0) {
        *pDStack_28 = (int)(local_50 & 0xff00) >> 8;
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        *pDStack_28 = 1;
      }
      *pdwExitCode_local = 3;
LAB_0016cd14:
      if (*pdwExitCode_local == 3) {
        _status[1] = 3;
        _status[2] = *pDStack_28;
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      (*(code *)**(undefined8 **)pLocalData)(pLocalData,hProcess_local,1);
    }
  }
  if (pDataLock != (IDataLock *)0x0) {
    (*pDataLock->_vptr_IDataLock[8])(pDataLock,hProcess_local);
  }
  return pobjProcess._4_4_;
}

Assistant:

PAL_ERROR
PROCGetProcessStatus(
    CPalThread *pThread,
    HANDLE hProcess,
    PROCESS_STATE *pps,
    DWORD *pdwExitCode
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjProcess = NULL;
    IDataLock *pDataLock;
    CProcProcessLocalData *pLocalData;
    pid_t wait_retval;
    int status;

    //
    // First, check if we already know the status of this process. This will be
    // the case if this function has already been called for the same process.
    //

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hProcess,
        &aotProcess,
        0,
        &pobjProcess
        );

    if (NO_ERROR != palError)
    {
        goto PROCGetProcessStatusExit;
    }

    palError = pobjProcess->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (PS_DONE == pLocalData->ps)
    {
        TRACE("We already called waitpid() on process ID %#x; process has "
              "terminated, exit code is %d\n",
              pLocalData->dwProcessId, pLocalData->dwExitCode);

        *pps = pLocalData->ps;
        *pdwExitCode = pLocalData->dwExitCode;

        pDataLock->ReleaseLock(pThread, FALSE);

        goto PROCGetProcessStatusExit;
    }

    /* By using waitpid(), we can even retrieve the exit code of a non-PAL
       process. However, note that waitpid() can only provide the low 8 bits
       of the exit code. This is all that is required for the PAL spec. */
    TRACE("Looking for status of process; trying wait()");

    while(1)
    {
        /* try to get state of process, using non-blocking call */
        wait_retval = waitpid(pLocalData->dwProcessId, &status, WNOHANG);

        if ( wait_retval == (pid_t) pLocalData->dwProcessId )
        {
            /* success; get the exit code */
            if ( WIFEXITED( status ) )
            {
                *pdwExitCode = WEXITSTATUS(status);
                TRACE("Exit code was %d\n", *pdwExitCode);
            }
            else
            {
                WARN("process terminated without exiting; can't get exit "
                     "code. faking it.\n");
                *pdwExitCode = EXIT_FAILURE;
            }
            *pps = PS_DONE;
        }
        else if (0 == wait_retval)
        {
            // The process is still running.
            TRACE("Process %#x is still active.\n", pLocalData->dwProcessId);
            *pps = PS_RUNNING;
            *pdwExitCode = 0;
        }
        else if (-1 == wait_retval)
        {
            // This might happen if waitpid() had already been called, but
            // this shouldn't happen - we call waitpid once, store the
            // result, and use that afterwards.
            // One legitimate cause of failure is EINTR; if this happens we
            // have to try again. A second legitimate cause is ECHILD, which
            // happens if we're trying to retrieve the status of a currently-
            // running process that isn't a child of this process.
            if (EINTR == errno)
            {
                TRACE("waitpid() failed with EINTR; re-waiting");
                continue;
            }
            else if (ECHILD == errno)
            {
                TRACE("waitpid() failed with ECHILD; calling kill instead");
                if (kill(pLocalData->dwProcessId, 0) != 0)
                {
                    if(ESRCH == errno)
                    {
                        WARN("kill() failed with ESRCH, i.e. target "
                             "process exited and it wasn't a child, "
                             "so can't get the exit code, assuming  "
                             "it was 0.\n");
                        *pdwExitCode = 0;
                    }
                    else
                    {
                        ERROR("kill(pid, 0) failed; errno is %d (%s)\n",
                              errno, strerror(errno));
                        *pdwExitCode = EXIT_FAILURE;
                    }
                    *pps = PS_DONE;
                }
                else
                {
                    *pps = PS_RUNNING;
                    *pdwExitCode = 0;
                }
            }
            else
            {
                // Ignoring unexpected waitpid errno and assuming that
                // the process is still running
                ERROR("waitpid(pid=%u) failed with unexpected errno=%d (%s)\n",
                      pLocalData->dwProcessId, errno, strerror(errno));
                *pps = PS_RUNNING;
                *pdwExitCode = 0;
            }
        }
        else
        {
            ASSERT("waitpid returned unexpected value %d\n",wait_retval);
            *pdwExitCode = EXIT_FAILURE;
            *pps = PS_DONE;
        }
        // Break out of the loop in all cases except EINTR.
        break;
    }

    // Save the exit code for future reference (waitpid will only work once).
    if(PS_DONE == *pps)
    {
        pLocalData->ps = PS_DONE;
        pLocalData->dwExitCode = *pdwExitCode;
    }

    TRACE( "State of process 0x%08x : %d (exit code %d)\n",
           pLocalData->dwProcessId, *pps, *pdwExitCode );

    pDataLock->ReleaseLock(pThread, TRUE);

PROCGetProcessStatusExit:

    if (NULL != pobjProcess)
    {
        pobjProcess->ReleaseReference(pThread);
    }

    return palError;
}